

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim.cpp
# Opt level: O0

bool32 __thiscall rw::AnimInterpolator::setCurrentAnim(AnimInterpolator *this,Animation *anim)

{
  FILE *__stream;
  char *pcVar1;
  InterpFrameHeader *pIVar2;
  KeyFrameHeader *pKVar3;
  KeyFrameHeader *pKVar4;
  KeyFrameHeader *kf2;
  KeyFrameHeader *kf1;
  InterpFrameHeader *intf;
  undefined4 local_38;
  Error _e;
  int32 maxkf;
  AnimInterpolatorInfo *interpInfo;
  int32 i;
  Animation *anim_local;
  AnimInterpolator *this_local;
  
  unique0x00012000 = anim->interpInfo;
  this->currentAnim = anim;
  this->currentTime = 0.0;
  _e.plugin = this->maxInterpKeyFrameSize + 0x10;
  if ((int)_e.plugin < unique0x00012000->interpKeyFrameSize) {
    intf._4_4_ = 0x1b;
    local_38 = 0x80000001;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/anim.cpp",0xe6);
    __stream = _stderr;
    pcVar1 = dbgsprint(0x80000001,"interpolation frame too big");
    fprintf(__stream,"%s\n",pcVar1);
    setError((Error *)((long)&intf + 4));
    this_local._4_4_ = 0;
  }
  else {
    this->currentInterpKeyFrameSize = unique0x00012000->interpKeyFrameSize;
    this->currentAnimKeyFrameSize = unique0x00012000->animKeyFrameSize;
    this->applyCB = unique0x00012000->applyCB;
    this->blendCB = unique0x00012000->blendCB;
    this->interpCB = unique0x00012000->interpCB;
    this->addCB = unique0x00012000->addCB;
    for (interpInfo._4_4_ = 0; interpInfo._4_4_ < this->numNodes;
        interpInfo._4_4_ = interpInfo._4_4_ + 1) {
      pIVar2 = getInterpFrame(this,interpInfo._4_4_);
      pKVar3 = getAnimFrame(this,interpInfo._4_4_);
      pKVar4 = getAnimFrame(this,interpInfo._4_4_ + this->numNodes);
      pIVar2->keyFrame1 = pKVar3;
      pIVar2->keyFrame2 = pKVar4;
      if (this->interpCB != (InterpCB)0x0) {
        (*this->interpCB)(pIVar2,pKVar3,pKVar4,0.0,anim->customData);
      }
    }
    pKVar3 = getAnimFrame(this,this->numNodes << 1);
    this->nextFrame = pKVar3;
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

bool32
AnimInterpolator::setCurrentAnim(Animation *anim)
{
	int32 i;
	AnimInterpolatorInfo *interpInfo = anim->interpInfo;
	this->currentAnim = anim;
	this->currentTime = 0.0f;
	int32 maxkf = this->maxInterpKeyFrameSize;
	if(sizeof(void*) > 4)	// see above in create()
		maxkf += 16;
	if(interpInfo->interpKeyFrameSize > maxkf){
		RWERROR((ERR_GENERAL, "interpolation frame too big"));
		return 0;
	}
	this->currentInterpKeyFrameSize = interpInfo->interpKeyFrameSize;
	this->currentAnimKeyFrameSize = interpInfo->animKeyFrameSize;
	this->applyCB = interpInfo->applyCB;
	this->blendCB = interpInfo->blendCB;
	this->interpCB = interpInfo->interpCB;
	this->addCB = interpInfo->addCB;
	for(i = 0; i < numNodes; i++){
		InterpFrameHeader *intf;
		KeyFrameHeader *kf1, *kf2;
		intf = this->getInterpFrame(i);
		kf1 = this->getAnimFrame(i);
		kf2 = this->getAnimFrame(i+numNodes);
		intf->keyFrame1 = kf1;
		intf->keyFrame2 = kf2;
		// TODO: perhaps just implement all interpolator infos?
		if(this->interpCB)
			this->interpCB(intf, kf1, kf2, 0.0f, anim->customData);
	}
	this->nextFrame = this->getAnimFrame(numNodes*2);
	return 1;
}